

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_mesh_completeness.cc
# Opt level: O3

vector<std::pair<lf::base::RefEl,_unsigned_int>,_std::allocator<std::pair<lf::base::RefEl,_unsigned_int>_>_>
* lf::mesh::test_utils::isWatertightMesh
            (vector<std::pair<lf::base::RefEl,_unsigned_int>,_std::allocator<std::pair<lf::base::RefEl,_unsigned_int>_>_>
             *__return_storage_ptr__,Mesh *mesh,bool vertices_only)

{
  double *pdVar1;
  long *plVar2;
  source_loc loc;
  element_type *this;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  size_type sVar6;
  undefined4 extraout_var;
  MatrixXd *pMVar8;
  long *plVar9;
  Scalar *pSVar10;
  long lVar11;
  undefined7 in_register_00000011;
  long extraout_RDX;
  ulong uVar12;
  long lVar13;
  double dVar14;
  string_view_t fmt;
  RefEl e_refel;
  VectorXd node_coords;
  MatrixXd vertex_coords;
  RefEl local_181;
  uint local_180;
  scalar_sum_op<double,_double> local_179;
  vector<std::pair<lf::base::RefEl,unsigned_int>,std::allocator<std::pair<lf::base::RefEl,unsigned_int>>>
  *local_178;
  uint local_16c;
  Matrix<double,__1,_1,_0,__1,_1> local_168;
  Scalar local_150;
  int local_144;
  ulong local_140;
  undefined8 *local_138;
  undefined8 *local_130;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_128;
  Matrix<double,__1,__1,_0,__1,__1> local_d8;
  char *local_c0;
  PointerType pdStack_b8;
  char *pcStack_b0;
  undefined8 local_a8;
  XprTypeNested pMStack_a0;
  long local_98;
  long lStack_90;
  Index local_88;
  RhsNested pMStack_80;
  Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> local_68;
  undefined8 *puVar7;
  
  uVar4 = (**mesh->_vptr_Mesh)(mesh,mesh,CONCAT71(in_register_00000011,vertices_only));
  (__return_storage_ptr__->
  super__Vector_base<std::pair<lf::base::RefEl,_unsigned_int>,_std::allocator<std::pair<lf::base::RefEl,_unsigned_int>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<lf::base::RefEl,_unsigned_int>,_std::allocator<std::pair<lf::base::RefEl,_unsigned_int>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<lf::base::RefEl,_unsigned_int>,_std::allocator<std::pair<lf::base::RefEl,_unsigned_int>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178 = (vector<std::pair<lf::base::RefEl,unsigned_int>,std::allocator<std::pair<lf::base::RefEl,unsigned_int>>>
               *)__return_storage_ptr__;
  if (0 < (int)uVar4) {
    local_16c = uVar4;
    do {
      local_140 = (ulong)uVar4;
      iVar5 = (*mesh->_vptr_Mesh[2])(mesh);
      puVar7 = (undefined8 *)CONCAT44(extraout_var,iVar5);
      if (extraout_RDX != 0) {
        local_144 = local_16c - (int)local_140;
        local_138 = puVar7 + extraout_RDX;
        do {
          plVar2 = (long *)*puVar7;
          local_181.type_ = (**(code **)(*plVar2 + 0x20))(plVar2);
          pMVar8 = base::RefEl::NodeCoords(&local_181);
          plVar9 = (long *)(**(code **)(*plVar2 + 0x18))(plVar2);
          (**(code **)(*plVar9 + 0x18))(&local_d8,plVar9,pMVar8);
          plVar9 = (long *)(**(code **)(*plVar2 + 0x18))(plVar2);
          (**(code **)(*plVar9 + 0x30))
                    ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_c0,plVar9,
                     pMVar8);
          pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                               &local_c0,0);
          local_150 = *pSVar10;
          free(local_c0);
          lVar11 = (**(code **)(*plVar2 + 8))(plVar2,local_144);
          local_150 = local_150 * 1e-08;
          uVar4 = 0;
          local_130 = puVar7;
          while( true ) {
            local_180 = uVar4;
            sVar6 = base::RefEl::NumNodes(&local_181);
            if (sVar6 <= uVar4) break;
            plVar9 = (long *)(**(code **)(**(long **)(lVar11 + (ulong)local_180 * 8) + 0x18))();
            local_128.m_lhs.
            super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
            .
            super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
            .
            super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
            .m_data = (PointerType)0x0;
            local_128.m_lhs.
            super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
            .
            super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
            .
            super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
            .m_rows.m_value = 0;
            local_128.m_lhs.
            super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
            .
            super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
            .
            super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
            ._16_8_ = 1;
            (**(code **)(*plVar9 + 0x18))
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_c0,
                       plVar9,&local_128);
            pcVar3 = local_c0;
            local_168.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data = (double *)0x0;
            local_168.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows = 0;
            Eigen::internal::
            resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,double,double>
                      (&local_168,(Matrix<double,__1,__1,_0,__1,__1> *)&local_c0,
                       (assign_op<double,_double> *)&local_68);
            uVar12 = local_168.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows -
                     (local_168.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows >> 0x3f) & 0xfffffffffffffffe;
            if (1 < local_168.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_rows) {
              lVar13 = 0;
              do {
                pdVar1 = (double *)(pcVar3 + lVar13 * 8);
                dVar14 = pdVar1[1];
                local_168.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data[lVar13] = *pdVar1;
                (local_168.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data + lVar13)[1] = dVar14;
                lVar13 = lVar13 + 2;
              } while (lVar13 < (long)uVar12);
            }
            if ((long)uVar12 <
                local_168.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows) {
              do {
                local_168.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data[uVar12] = *(double *)(pcVar3 + uVar12 * 8);
                uVar12 = uVar12 + 1;
              } while (local_168.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_rows != uVar12);
            }
            free(local_c0);
            free(local_128.m_lhs.
                 super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                 .
                 super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                 .m_data);
            Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                      (&local_68,&local_d8,(ulong)local_180);
            Eigen::
            CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
            ::CwiseBinaryOp(&local_128,&local_68,&local_168,
                            (scalar_difference_op<double,_double> *)&local_c0);
            local_88 = local_128.m_lhs.
                       super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                       .m_outerStride;
            pMStack_80 = local_128.m_rhs;
            local_98 = local_128.m_lhs.
                       super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                       .m_startRow.m_value;
            lStack_90 = local_128.m_lhs.
                        super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                        .
                        super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                        .m_startCol.m_value;
            local_a8 = local_128.m_lhs.
                       super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                       .
                       super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                       ._16_8_;
            pMStack_a0 = local_128.m_lhs.
                         super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                         .
                         super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                         .m_xpr;
            pdStack_b8 = local_128.m_lhs.
                         super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                         .
                         super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                         .
                         super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                         .m_data;
            pcStack_b0 = (char *)local_128.m_lhs.
                                 super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                                 .
                                 super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                                 .
                                 super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                                 .m_rows.m_value;
            if (((local_128.m_rhs)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                m_storage.m_rows == 0) {
              dVar14 = 0.0;
            }
            else {
              dVar14 = Eigen::
                       DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>
                       ::redux<Eigen::internal::scalar_sum_op<double,double>>
                                 ((DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                                   *)&local_c0,&local_179);
            }
            if (local_150 < dVar14) {
              iVar5 = (*mesh->_vptr_Mesh[5])(mesh,plVar2);
              local_c0 = (char *)CONCAT44(local_c0._4_4_,iVar5);
              std::
              vector<std::pair<lf::base::RefEl,unsigned_int>,std::allocator<std::pair<lf::base::RefEl,unsigned_int>>>
              ::emplace_back<lf::base::RefEl_const&,unsigned_int>
                        (local_178,&local_181,(uint *)&local_c0);
              WatertightLogger();
              this = WatertightLogger::logger.
                     super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              iVar5 = (*mesh->_vptr_Mesh[5])(mesh);
              local_128.m_lhs.
              super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
              .
              super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
              .
              super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
              .m_data = (PointerType)
                        CONCAT44(local_128.m_lhs.
                                 super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                                 .
                                 super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                                 .
                                 super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                                 .m_data._4_4_,iVar5);
              local_c0 = 
              "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/test_utils/check_mesh_completeness.cc"
              ;
              pdStack_b8 = (PointerType)CONCAT44(pdStack_b8._4_4_,0x75);
              pcStack_b0 = "isWatertightMesh";
              loc._8_8_ = pdStack_b8;
              loc.filename = 
              "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/test_utils/check_mesh_completeness.cc"
              ;
              loc.funcname = "isWatertightMesh";
              fmt.size_ = 0x25;
              fmt.data_ = "Node {} of {} ({}): position mismatch";
              spdlog::logger::log_<unsigned_int&,lf::base::RefEl_const&,unsigned_int>
                        (this,loc,trace,fmt,&local_180,&local_181,(uint *)&local_128);
            }
            free(local_168.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data);
            uVar4 = local_180 + 1;
          }
          free(local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_data);
          puVar7 = local_130 + 1;
        } while (puVar7 != local_138);
      }
      uVar4 = (int)local_140 - 1;
    } while (1 < (int)local_140);
  }
  return (vector<std::pair<lf::base::RefEl,_unsigned_int>,_std::allocator<std::pair<lf::base::RefEl,_unsigned_int>_>_>
          *)local_178;
}

Assistant:

std::vector<std::pair<lf::base::RefEl, base::glb_idx_t>> isWatertightMesh(
    const Mesh& mesh, bool vertices_only) {
  base::dim_t dim_mesh = mesh.DimMesh();
  std::vector<std::pair<lf::base::RefEl, base::glb_idx_t>> ret_vals{};

  // "Reference coordinates" for a point: dummy argument
  Eigen::Matrix<double, 0, 1> pt_ref_coord;

  // Loop over cells and edges
  for (int co_dim = dim_mesh; co_dim > 0; co_dim--) {
    base::dim_t codim_pt = dim_mesh - co_dim;  // co-dim of vertices
    // Loop over entities of the specified co-dimension
    for (const Entity* e : mesh.Entities(co_dim)) {
      const lf::base::RefEl e_refel = e->RefEl();
      const Eigen::MatrixXd& ref_el_corners(e_refel.NodeCoords());
      const Eigen::MatrixXd vertex_coords(
          e->Geometry()->Global(ref_el_corners));
      const double approx_area =
          (e->Geometry()->IntegrationElement(ref_el_corners))[0];
      // Visit all nodes
      auto sub_ents = e->SubEntities(codim_pt);
      for (base::sub_idx_t j = 0; j < e_refel.NumNodes(); ++j) {
        const Eigen::VectorXd node_coords(
            sub_ents[j]->Geometry()->Global(pt_ref_coord));
        // Check agreement of coordinates up to roundoff
        if ((vertex_coords.col(j) - node_coords).squaredNorm() >
            1.0E-8 * approx_area) {
          ret_vals.emplace_back(e_refel, mesh.Index(*e));

          SPDLOG_LOGGER_TRACE(WatertightLogger(),
                              "Node {} of {} ({}): position mismatch", j,
                              e_refel, mesh.Index(*e));

        }  // end geometry test
      }  // end loop over nodes
    }  // end loop over entities
  }  // end loop over co-dimensions
  if (!vertices_only) {
    // Check whether geometry of edges and cells match
    // ASSERT_MSG(false,
    //	    "Geometric compatibility test for edges and cells not yet
    // implemented");
  }

  return ret_vals;
}